

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

void bcread_error(LexState *ls,ErrMsg em)

{
  lua_State *L_00;
  char *local_28;
  char *name;
  lua_State *L;
  ErrMsg em_local;
  LexState *ls_local;
  
  L_00 = ls->L;
  local_28 = ls->chunkarg;
  if (*local_28 == '\x1b') {
    local_28 = "(binary)";
  }
  else if ((*local_28 == '@') || (*local_28 == '=')) {
    local_28 = local_28 + 1;
  }
  lj_strfmt_pushf(L_00,"%s: %s",local_28,lj_err_allmsg + (int)em);
  lj_err_throw(L_00,3);
}

Assistant:

static LJ_NOINLINE void bcread_error(LexState *ls, ErrMsg em)
{
  lua_State *L = ls->L;
  const char *name = ls->chunkarg;
  if (*name == BCDUMP_HEAD1) name = "(binary)";
  else if (*name == '@' || *name == '=') name++;
  lj_strfmt_pushf(L, "%s: %s", name, err2msg(em));
  lj_err_throw(L, LUA_ERRSYNTAX);
}